

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet.cpp
# Opt level: O1

void __thiscall cppnet::CppNet::~CppNet(CppNet *this)

{
  CppNetBase *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  this_00 = (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (CppNetBase *)0x0) {
    CppNetBase::Dealloc(this_00);
  }
  this_01 = (this->_cppnet_base).super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    return;
  }
  return;
}

Assistant:

CppNet::~CppNet() {
    if (_cppnet_base) {
        _cppnet_base->Dealloc();
    }
}